

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

PixelBufferAccess *
tcu::flipYAccess(PixelBufferAccess *__return_storage_ptr__,PixelBufferAccess *access)

{
  int iVar1;
  IVec3 pitch;
  IVec3 local_14;
  
  iVar1 = (access->super_ConstPixelBufferAccess).m_pitch.m_data[1];
  local_14.m_data[1] = -iVar1;
  local_14.m_data[0] = (access->super_ConstPixelBufferAccess).m_pitch.m_data[0];
  local_14.m_data[2] = (access->super_ConstPixelBufferAccess).m_pitch.m_data[2];
  PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,(TextureFormat *)access,
             &(access->super_ConstPixelBufferAccess).m_size,&local_14,
             (void *)((long)(((access->super_ConstPixelBufferAccess).m_size.m_data[1] + -1) * iVar1)
                     + (long)(access->super_ConstPixelBufferAccess).m_data));
  return __return_storage_ptr__;
}

Assistant:

PixelBufferAccess flipYAccess (const PixelBufferAccess& access)
{
	const int			rowPitch		= access.getRowPitch();
	const int			offsetToLast	= rowPitch*(access.getHeight()-1);
	const tcu::IVec3	pitch			(access.getPixelPitch(), -rowPitch, access.getSlicePitch());

	return PixelBufferAccess(access.getFormat(), access.getSize(), pitch, (deUint8*)access.getDataPtr() + offsetToLast);
}